

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int session_predicate_response_headers_send(nghttp2_session *session,nghttp2_stream *stream)

{
  int iVar1;
  int iVar2;
  
  if (stream == (nghttp2_stream *)0x0) {
    return -0x1fe;
  }
  iVar1 = session_is_closing(session);
  iVar2 = -0x212;
  if ((iVar1 == 0) && (iVar2 = -0x200, (stream->shut_flags & 2) == 0)) {
    if (session->server == '\0') {
      iVar2 = -0x1f9;
    }
    else {
      iVar2 = -0x201;
      if (stream->stream_id == 0 || (stream->stream_id & 1U) != 0) {
        iVar2 = 0;
        if (stream->state != NGHTTP2_STREAM_OPENING) {
          iVar2 = (uint)(stream->state == NGHTTP2_STREAM_CLOSING) * 3 + -0x202;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int session_predicate_response_headers_send(nghttp2_session *session,
                                                   nghttp2_stream *stream) {
  int rv;
  rv = session_predicate_for_stream_send(session, stream);
  if (rv != 0) {
    return rv;
  }
  assert(stream);
  if (!session->server) {
    return NGHTTP2_ERR_PROTO;
  }
  if (nghttp2_session_is_my_stream_id(session, stream->stream_id)) {
    return NGHTTP2_ERR_INVALID_STREAM_ID;
  }
  switch (stream->state) {
  case NGHTTP2_STREAM_OPENING:
    return 0;
  case NGHTTP2_STREAM_CLOSING:
    return NGHTTP2_ERR_STREAM_CLOSING;
  default:
    return NGHTTP2_ERR_INVALID_STREAM_STATE;
  }
}